

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.h
# Opt level: O2

void __thiscall testing::internal::FilePath::FilePath(FilePath *this,string *pathname)

{
  std::__cxx11::string::string((string *)this,(string *)pathname);
  Normalize(this);
  return;
}

Assistant:

explicit FilePath(const std::string& pathname) : pathname_(pathname) {
    Normalize();
  }